

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::write_float<char,fmt::v11::basic_appender<char>,double>
          (basic_appender<char> out,double value,format_specs specs,locale_ref loc)

{
  basic_appender<char> bVar1;
  code *buf;
  basic_specs bVar2;
  sign s;
  ulong uVar3;
  basic_specs this;
  format_specs *in_R8;
  sign in_R9D;
  int precision;
  uint uVar4;
  format_specs specs_00;
  format_specs specs_01;
  string_view bytes;
  decimal_fp<double> dVar5;
  format_specs specs_local;
  big_decimal_fp f;
  memory_buffer buffer;
  
  bVar2 = specs._8_8_;
  this = specs.super_basic_specs;
  uVar4 = specs.super_basic_specs.data_;
  uVar3 = 1;
  if (-1 < (long)value) {
    uVar3 = (ulong)((uint)((ulong)this >> 10) & 3);
  }
  s = (sign)uVar3;
  specs_local.super_basic_specs = this;
  specs_local._8_8_ = bVar2;
  if (0x7fefffffffffffff < (ulong)ABS(value)) {
    bVar1.container._1_7_ = 0;
    bVar1.container._0_1_ = NAN(value);
    specs_01.width = (int)uVar3;
    specs_01.precision = (int)(uVar3 >> 0x20);
    specs_01.super_basic_specs = bVar2;
    bVar1 = write_nonfinite<char,fmt::v11::basic_appender<char>>
                      (out.container,bVar1,specs.super_basic_specs.data_._0_1_,specs_01,in_R9D);
    return (basic_appender<char>)bVar1.container;
  }
  if (s != none && (uVar4 & 0x38) == 0x20) {
    buffer.super_buffer<char>.ptr_ = (char *)out.container;
    basic_appender<char>::operator=
              ((basic_appender<char> *)&buffer,(char)(0x202b2d00 >> (sbyte)(s << 3)));
    s = none;
    if (specs.width != 0) {
      specs_local.width = specs.width + -1;
    }
  }
  precision = specs.precision;
  if ((long)bVar2 < 0) {
    if (((undefined1  [16])specs & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
      dVar5 = dragonbox::to_decimal<double>(value);
      buffer.super_buffer<char>.ptr_ = (char *)dVar5.significand;
      buffer.super_buffer<char>.size_ =
           CONCAT44(buffer.super_buffer<char>.size_._4_4_,dVar5.exponent);
      bVar1 = do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>
                        (out,(decimal_fp<double> *)&buffer,&specs_local,s,0x10,loc);
      return (basic_appender<char>)bVar1.container;
    }
    precision = 6;
  }
  buffer.super_buffer<char>.ptr_ = buffer.store_;
  buffer.super_buffer<char>.size_ = 0;
  buf = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  buffer.super_buffer<char>.grow_ =
       basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  buffer.super_buffer<char>.capacity_ = 500;
  if ((specs.super_basic_specs.data_._0_1_ & 7U) == 1) {
    if (precision == 0x7fffffff) {
      report_error("number is too big");
    }
    precision = precision + 1;
LAB_001f5439:
    if ((ulong)bVar2 >> 0x20 != 0) {
      specs_local.super_basic_specs =
           (basic_specs)(CONCAT44(specs_local.super_basic_specs.fill_data_,uVar4) | 0x2000);
    }
  }
  else {
    if ((uVar4 & 7) == 2) goto LAB_001f5439;
    if ((uVar4 & 7) == 4) {
      if (s != none) {
        buf = (code *)(ulong)(s << 3);
        f.significand = (char *)CONCAT71(f.significand._1_7_,(char)(0x202b2d00 >> (sbyte)(s << 3)));
        buffer<char>::push_back(&buffer.super_buffer<char>,(char *)&f);
        this = specs_local.super_basic_specs;
      }
      specs_00._8_8_ = &buffer;
      specs_00.super_basic_specs = (basic_specs)specs_local._8_8_;
      format_hexfloat<double,_0>((detail *)this,value,specs_00,(buffer<char> *)buf);
      bytes.size_ = (size_t)&specs_local;
      bytes.data_ = (char *)buffer.super_buffer<char>.size_;
      bVar1 = write_bytes<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>>
                        (out.container,(basic_appender<char>)buffer.super_buffer<char>.ptr_,bytes,
                         in_R8);
      goto LAB_001f5496;
    }
    precision = precision + (uint)(precision == 0);
  }
  f.exponent = format_float<double>(value,precision,&specs_local,false,&buffer.super_buffer<char>);
  specs_local.precision = precision;
  f.significand = buffer.super_buffer<char>.ptr_;
  f.significand_size = (int)buffer.super_buffer<char>.size_;
  bVar1 = do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>
                    (out,&f,&specs_local,s,0x10,loc);
LAB_001f5496:
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::deallocate(&buffer);
  return (basic_appender<char>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value, format_specs specs,
                                 locale_ref loc) -> OutputIt {
  // Use signbit because value < 0 is false for NaN.
  sign s = detail::signbit(value) ? sign::minus : specs.sign();

  if (!detail::isfinite(value))
    return write_nonfinite<Char>(out, detail::isnan(value), specs, s);

  if (specs.align() == align::numeric && s != sign::none) {
    *out++ = detail::getsign<Char>(s);
    s = sign::none;
    if (specs.width != 0) --specs.width;
  }

  constexpr int exp_upper = detail::exp_upper<T>();
  int precision = specs.precision;
  if (precision < 0) {
    if (specs.type() != presentation_type::none) {
      precision = 6;
    } else if (is_fast_float<T>::value && !is_constant_evaluated()) {
      // Use Dragonbox for the shortest format.
      using floaty = conditional_t<sizeof(T) >= sizeof(double), double, float>;
      auto dec = dragonbox::to_decimal(static_cast<floaty>(value));
      return write_float<Char>(out, dec, specs, s, exp_upper, loc);
    }
  }

  memory_buffer buffer;
  if (specs.type() == presentation_type::hexfloat) {
    if (s != sign::none) buffer.push_back(detail::getsign<char>(s));
    format_hexfloat(convert_float(value), specs, buffer);
    return write_bytes<Char, align::right>(out, {buffer.data(), buffer.size()},
                                           specs);
  }

  if (specs.type() == presentation_type::exp) {
    if (precision == max_value<int>())
      report_error("number is too big");
    else
      ++precision;
    if (specs.precision != 0) specs.set_alt();
  } else if (specs.type() == presentation_type::fixed) {
    if (specs.precision != 0) specs.set_alt();
  } else if (precision == 0) {
    precision = 1;
  }
  int exp = format_float(convert_float(value), precision, specs,
                         std::is_same<T, float>(), buffer);

  specs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float<Char>(out, f, specs, s, exp_upper, loc);
}